

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O1

void __thiscall chrono::ChSolverPMINRES::ArchiveIN(ChSolverPMINRES *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChSolverPMINRES *)&this[-1].grad_diffstep,in_RSI);
  return;
}

Assistant:

void ChSolverPMINRES::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSolverPMINRES>();
    // deserialize parent class
    ChIterativeSolverVI::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(grad_diffstep);
    marchive >> CHNVP(rel_tolerance);
    marchive >> CHNVP(m_use_precond);
}